

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32ppcbe.c
# Opt level: O0

uint8_t setupRI(uint8_t rtype,ELF2vlink *convert,RelocInsert *ri1,RelocInsert *ri2)

{
  long lVar1;
  void *in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  byte in_DIL;
  
  *(undefined2 *)(in_RDX + 1) = *(undefined2 *)(in_RSI + (ulong)in_DIL * 0x10 + 2);
  *(undefined2 *)((long)in_RDX + 10) = *(undefined2 *)(in_RSI + (ulong)in_DIL * 0x10 + 4);
  lVar1 = *(long *)(in_RSI + (ulong)in_DIL * 0x10 + 8);
  in_RDX[2] = lVar1;
  if (lVar1 == 0) {
    memset(in_RCX,0,0x18);
    *in_RDX = in_RCX;
    in_RDX[2] = 0xffff0000;
    *(undefined2 *)((long)in_RCX + 10) = 0x10;
    *(undefined8 *)((long)in_RCX + 0x10) = 0x8000;
  }
  return *(uint8_t *)(in_RSI + (ulong)in_DIL * 0x10);
}

Assistant:

static uint8_t setupRI(uint8_t rtype,struct ELF2vlink *convert,
                       struct RelocInsert *ri1,struct RelocInsert *ri2)
{
  ri1->bpos = convert[rtype].bpos;
  ri1->bsiz = convert[rtype].bsiz;
  if ((ri1->mask = convert[rtype].mask) == 0) {
    /* @ha mode - add a second RelocInsert */
    memset(ri2,0,sizeof(struct RelocInsert));
    ri1->next = ri2;
    ri1->mask = 0xffff0000;
    ri2->bsiz = 16;
    ri2->mask = 0x8000;
  }
  return convert[rtype].rtype;
}